

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

void __thiscall EOPlus::Parser_Token_Server_Base::PutBack(Parser_Token_Server_Base *this,Token *t)

{
  int iVar1;
  undefined1 local_c0 [64];
  undefined1 local_80 [80];
  
  Token::operator=(&this->reject_token,t);
  this->reject_line = this->line;
  iVar1 = this->line - t->newlines;
  this->line = iVar1;
  if (t->type == NewLine) {
    this->line = iVar1 + -1;
  }
  while (iVar1 = t->newlines, t->newlines = iVar1 + -1, 0 < iVar1) {
    util::variant::variant((variant *)local_c0);
    Token::Token((Token *)local_80,NewLine,(variant *)local_c0);
    std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::emplace_back<EOPlus::Token>
              (&(this->token_buffer).c,(Token *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 0x18));
    std::__cxx11::string::~string((string *)(local_c0 + 0x10));
  }
  std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::push_back(&(this->token_buffer).c,t);
  return;
}

Assistant:

void Parser_Token_Server_Base::PutBack(Token t)
	{
		this->reject_token = t;
		this->reject_line = this->line;
		this->line -= t.newlines;

		if (t.type == Token::NewLine)
			--this->line;

		while (t.newlines-- > 0)
			this->token_buffer.push(Token(Token::NewLine));

		this->token_buffer.push(t);
	}